

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O0

double r8_hyper_2f1(double a,double b,double c,double x)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double x1;
  double sp0;
  double sp;
  double sm;
  double rp;
  double rm;
  double r1;
  double r0;
  double r;
  double r8_pi;
  double pb;
  double pa;
  int nm;
  int m;
  bool l5;
  int iStack_100;
  bool l4;
  bool l3;
  bool l2;
  bool l1;
  bool l0;
  int k;
  int j;
  double hw;
  double hf;
  double gm;
  double gcb;
  double gcab;
  double gca;
  double gc;
  double gbm;
  double gb;
  double gam;
  double gabc;
  double ga;
  double g3;
  double g2;
  double g1;
  double g0;
  double f1;
  double f0;
  double eps;
  double el;
  double c1;
  double c0;
  double bb;
  double aa;
  double a0;
  double x_local;
  double c_local;
  double b_local;
  double a_local;
  
  bVar3 = false;
  if ((c == (double)(int)c) && (!NAN(c) && !NAN((double)(int)c))) {
    bVar3 = c < 0.0;
  }
  bVar4 = false;
  if ((a == (double)(int)a) && (!NAN(a) && !NAN((double)(int)a))) {
    bVar4 = a < 0.0;
  }
  bVar5 = false;
  if ((b == (double)(int)b) && (!NAN(b) && !NAN((double)(int)b))) {
    bVar5 = b < 0.0;
  }
  bVar1 = false;
  if ((c - a == (double)(int)(c - a)) && (!NAN(c - a) && !NAN((double)(int)(c - a)))) {
    bVar1 = c - a <= 0.0;
  }
  bVar2 = false;
  if ((c - b == (double)(int)(c - b)) && (!NAN(c - b) && !NAN((double)(int)(c - b)))) {
    bVar2 = c - b <= 0.0;
  }
  if (bVar3) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
    std::operator<<((ostream *)&std::cerr,"  C is integral and negative.\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,"  C = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,c);
    std::operator<<(poVar7,"\n");
    exit(1);
  }
  if (1.0 - x < 1e-15 && (c - a) - b <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"R8_HYPER_2F1 - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  The hypergeometric series is divergent.\n");
    std::operator<<((ostream *)&std::cerr,"  1 - X < 0, C - A - B <= 0\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,"  A = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,a);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,"  B = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,b);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,"  C = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,c);
    std::operator<<(poVar7,"\n");
    poVar7 = std::operator<<((ostream *)&std::cerr,"  X = ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,x);
    std::operator<<(poVar7,"\n");
    exit(1);
  }
  if (x <= 0.95) {
    f0 = 1e-15;
  }
  else {
    f0 = 1e-08;
  }
  if ((((x == 0.0) && (!NAN(x))) || ((a == 0.0 && (!NAN(a))))) || ((b == 0.0 && (!NAN(b))))) {
    a_local = 1.0;
  }
  else if (((1.0 - x != f0) || (NAN(1.0 - x) || NAN(f0))) || ((c - a) - b <= 0.0)) {
    if ((f0 < x + 1.0) || (f0 < ABS(((c - a) + b) - 1.0))) {
      if ((bVar4) || (bVar5)) {
        if (bVar4) {
          pa._0_4_ = (int)ABS(a);
        }
        if (bVar5) {
          pa._0_4_ = (int)ABS(b);
        }
        hw = 1.0;
        r0 = 1.0;
        for (iStack_100 = 1; iStack_100 <= pa._0_4_; iStack_100 = iStack_100 + 1) {
          r0 = ((r0 * ((a + (double)iStack_100) - 1.0) * ((b + (double)iStack_100) - 1.0)) /
               ((double)iStack_100 * ((c + (double)iStack_100) - 1.0))) * x;
          hw = hw + r0;
        }
        a_local = hw;
      }
      else if ((bVar1) || (bVar2)) {
        if (bVar1) {
          pa._0_4_ = (int)ABS(c - a);
        }
        if (bVar2) {
          pa._0_4_ = (int)ABS(c - b);
        }
        hw = 1.0;
        r0 = 1.0;
        for (iStack_100 = 1; iStack_100 <= pa._0_4_; iStack_100 = iStack_100 + 1) {
          r0 = ((r0 * (((c - a) + (double)iStack_100) - 1.0) *
                (((c - b) + (double)iStack_100) - 1.0)) /
               ((double)iStack_100 * ((c + (double)iStack_100) - 1.0))) * x;
          hw = hw + r0;
        }
        dVar9 = pow(1.0 - x,(c - a) - b);
        a_local = dVar9 * hw;
      }
      else {
        a0 = x;
        c_local = b;
        b_local = a;
        if (x < 0.0) {
          a0 = x / (x - 1.0);
          if (((a < c) && (b < a)) && (0.0 < b)) {
            c_local = a;
            b_local = b;
          }
          c_local = c - c_local;
        }
        if (a0 < 0.75) {
          aa = 1.0;
          if (((b_local < c) && (c < b_local * 2.0)) && ((c_local < c && (c < c_local * 2.0)))) {
            aa = pow(1.0 - a0,(c - b_local) - c_local);
            b_local = c - b_local;
            c_local = c - c_local;
          }
          hw = 1.0;
          r0 = 1.0;
          for (iStack_100 = 1; iStack_100 < 0xfb; iStack_100 = iStack_100 + 1) {
            r0 = ((r0 * ((b_local + (double)iStack_100) - 1.0) *
                  ((c_local + (double)iStack_100) - 1.0)) /
                 ((double)iStack_100 * ((c + (double)iStack_100) - 1.0))) * a0;
            dVar9 = hw + r0;
            dVar10 = dVar9 - hw;
            hw = dVar9;
            if (ABS(dVar10) <= ABS(dVar9) * f0) break;
          }
          hw = aa * hw;
        }
        else {
          hf = 0.0;
          if (1e-15 <= ABS(((c - b_local) - c_local) - (double)(int)((c - b_local) - c_local))) {
            dVar9 = tgamma(b_local);
            dVar10 = tgamma(c_local);
            dVar11 = tgamma(c);
            dVar12 = tgamma(c - b_local);
            dVar13 = tgamma(c - c_local);
            dVar14 = tgamma((c - b_local) - c_local);
            dVar15 = tgamma((b_local + c_local) - c);
            dVar12 = (dVar11 * dVar14) / (dVar12 * dVar13);
            dVar13 = pow(1.0 - a0,(c - b_local) - c_local);
            dVar13 = ((dVar11 * dVar15) / (dVar9 * dVar10)) * dVar13;
            hw = 0.0;
            rm = dVar13;
            r1 = dVar12;
            for (iStack_100 = 1; iStack_100 < 0xfb; iStack_100 = iStack_100 + 1) {
              r1 = ((r1 * ((b_local + (double)iStack_100) - 1.0) *
                    ((c_local + (double)iStack_100) - 1.0)) /
                   ((double)iStack_100 * (((b_local + c_local) - c) + (double)iStack_100))) *
                   (1.0 - a0);
              rm = ((rm * (((c - b_local) + (double)iStack_100) - 1.0) *
                    (((c - c_local) + (double)iStack_100) - 1.0)) /
                   ((double)iStack_100 * (((c - b_local) - c_local) + (double)iStack_100))) *
                   (1.0 - a0);
              dVar9 = hw + r1 + rm;
              dVar10 = dVar9 - hw;
              hw = dVar9;
              if (ABS(dVar10) < ABS(dVar9) * f0) break;
            }
            hw = hw + dVar12 + dVar13;
          }
          else {
            iVar6 = (int)((c - b_local) - c_local);
            dVar9 = tgamma(b_local);
            dVar10 = tgamma(c_local);
            dVar11 = tgamma(c);
            dVar12 = tgamma(b_local + (double)iVar6);
            dVar13 = tgamma(c_local + (double)iVar6);
            dVar14 = r8_psi(b_local);
            dVar15 = r8_psi(c_local);
            if (iVar6 != 0) {
              hf = 1.0;
            }
            _l3 = 1;
            while( true ) {
              iVar8 = iVar6;
              if (iVar6 < 1) {
                iVar8 = -iVar6;
              }
              if (iVar8 + -1 < _l3) break;
              hf = hf * (double)_l3;
              _l3 = _l3 + 1;
            }
            rp = 1.0;
            _l3 = 1;
            while( true ) {
              iVar8 = iVar6;
              if (iVar6 < 1) {
                iVar8 = -iVar6;
              }
              if (iVar8 < _l3) break;
              rp = rp * (double)_l3;
              _l3 = _l3 + 1;
            }
            f1 = 1.0;
            r1 = 1.0;
            rm = 1.0;
            x1 = 0.0;
            sp0 = 0.0;
            if (iVar6 < 0) {
              if (iVar6 < 0) {
                iVar8 = -iVar6;
                dVar16 = pow(1.0 - a0,(double)iVar8);
                dVar17 = pow(-1.0,(double)iVar8);
                for (iStack_100 = 1; iStack_100 <= iVar8 + -1; iStack_100 = iStack_100 + 1) {
                  r1 = ((r1 * (((b_local - (double)iVar8) + (double)iStack_100) - 1.0) *
                        (((c_local - (double)iVar8) + (double)iStack_100) - 1.0)) /
                       (double)(iStack_100 * (iStack_100 + iVar6))) * (1.0 - a0);
                  f1 = f1 + r1;
                }
                for (iStack_100 = 1; iStack_100 <= iVar8; iStack_100 = iStack_100 + 1) {
                  x1 = x1 + 1.0 / (double)iStack_100;
                }
                dVar18 = log(1.0 - a0);
                g0 = ((dVar14 + dVar15) - x1) + 1.1544313298030657 + dVar18;
                for (iStack_100 = 1; iStack_100 < 0xfb; iStack_100 = iStack_100 + 1) {
                  sp0 = sp0 + (1.0 - b_local) /
                              ((double)iStack_100 * ((b_local + (double)iStack_100) - 1.0)) +
                        (1.0 - c_local) /
                        ((double)iStack_100 * ((c_local + (double)iStack_100) - 1.0));
                  sp = 0.0;
                  for (_l3 = 1; _l3 <= iVar8; _l3 = _l3 + 1) {
                    sp = sp + 1.0 / (double)(_l3 + iStack_100);
                  }
                  dVar18 = log(1.0 - a0);
                  rm = ((rm * ((b_local + (double)iStack_100) - 1.0) *
                        ((c_local + (double)iStack_100) - 1.0)) /
                       (double)(iStack_100 * (iVar8 + iStack_100))) * (1.0 - a0);
                  dVar18 = rm * (((dVar14 + dVar15 + 1.1544313298030657 + sp0) - sp) + dVar18) + g0;
                  dVar19 = dVar18 - g0;
                  g0 = dVar18;
                  if (ABS(dVar19) < ABS(dVar18) * f0) break;
                }
                hw = f1 * ((hf * dVar11) / (dVar9 * dVar10 * dVar16)) +
                     g0 * ((-dVar17 * dVar11) / (dVar12 * dVar13 * rp));
              }
            }
            else {
              dVar16 = pow(a0 - 1.0,(double)iVar6);
              for (iStack_100 = 1; iStack_100 <= iVar6 + -1; iStack_100 = iStack_100 + 1) {
                r1 = ((r1 * ((b_local + (double)iStack_100) - 1.0) *
                      ((c_local + (double)iStack_100) - 1.0)) /
                     (double)(iStack_100 * (iStack_100 - iVar6))) * (1.0 - a0);
                f1 = f1 + r1;
              }
              for (iStack_100 = 1; iStack_100 <= iVar6; iStack_100 = iStack_100 + 1) {
                x1 = (x1 + 1.0 / ((b_local + (double)iStack_100) - 1.0) +
                     1.0 / ((c_local + (double)iStack_100) - 1.0)) - 1.0 / (double)iStack_100;
              }
              dVar17 = log(1.0 - a0);
              g0 = dVar14 + dVar15 + x1 + 1.1544313298030657 + dVar17;
              for (iStack_100 = 1; iStack_100 < 0xfb; iStack_100 = iStack_100 + 1) {
                sp0 = sp0 + (1.0 - b_local) /
                            ((double)iStack_100 * ((b_local + (double)iStack_100) - 1.0)) +
                      (1.0 - c_local) /
                      ((double)iStack_100 * ((c_local + (double)iStack_100) - 1.0));
                sp = 0.0;
                for (_l3 = 1; _l3 <= iVar6; _l3 = _l3 + 1) {
                  sp = sp + (1.0 - b_local) /
                            ((double)(_l3 + iStack_100) *
                            ((b_local + (double)_l3 + (double)iStack_100) - 1.0)) +
                       1.0 / ((c_local + (double)_l3 + (double)iStack_100) - 1.0);
                }
                dVar17 = log(1.0 - a0);
                rm = ((rm * ((b_local + (double)iVar6 + (double)iStack_100) - 1.0) *
                      ((c_local + (double)iVar6 + (double)iStack_100) - 1.0)) /
                     (double)(iStack_100 * (iVar6 + iStack_100))) * (1.0 - a0);
                dVar17 = rm * (dVar14 + dVar15 + 1.1544313298030657 + sp0 + sp + dVar17) + g0;
                dVar18 = dVar17 - g0;
                g0 = dVar17;
                if (ABS(dVar18) < ABS(dVar17) * f0) break;
              }
              hw = f1 * ((hf * dVar11) / (dVar12 * dVar13)) +
                   g0 * ((-dVar11 * dVar16) / (dVar9 * dVar10 * rp));
            }
          }
        }
        if (x < 0.0) {
          dVar9 = pow(1.0 - x,a);
          hw = (1.0 / dVar9) * hw;
        }
        if (0x78 < iStack_100) {
          std::operator<<((ostream *)&std::cout,"\n");
          std::operator<<((ostream *)&std::cout,"R8_HYPER_2F1 - Warning!\n");
          std::operator<<((ostream *)&std::cout,"  A large number of iterations were needed.\n");
          std::operator<<((ostream *)&std::cout,"  The accuracy of the results should be checked.\n"
                         );
        }
        a_local = hw;
      }
    }
    else {
      dVar9 = sqrt(3.141592653589793);
      dVar10 = pow(2.0,-a);
      dVar11 = tgamma(c);
      dVar12 = tgamma((a / 2.0 + 1.0) - b);
      dVar13 = tgamma(a * 0.5 + 0.5);
      a_local = (dVar9 * dVar10 * dVar11) / (dVar12 * dVar13);
    }
  }
  else {
    dVar9 = tgamma(c);
    dVar10 = tgamma((c - a) - b);
    dVar11 = tgamma(c - a);
    dVar12 = tgamma(c - b);
    a_local = (dVar9 * dVar10) / (dVar11 * dVar12);
  }
  return a_local;
}

Assistant:

double r8_hyper_2f1 ( double a, double b, double c, double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_HYPER_2F1 evaluates the hypergeometric function F(A,B,C,X).
//
//  Discussion:
//
//    A minor bug was corrected.  The HW variable, used in several places as
//    the "old" value of a quantity being iteratively improved, was not
//    being initialized.  JVB, 11 February 2008.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    05 July 2009
//
//  Author:
//
//    Original FORTRAN77 original by Shanjie Zhang, Jianming Jin.
//    C++ version by John Burkardt.
//
//    The original FORTRAN77 version of this routine is copyrighted by
//    Shanjie Zhang and Jianming Jin.  However, they give permission to
//    incorporate this routine into a user program provided that the copyright
//    is acknowledged.
//
//  Reference:
//
//    Shanjie Zhang, Jianming Jin,
//    Computation of Special Functions,
//    Wiley, 1996,
//    ISBN: 0-471-11963-6,
//    LC: QA351.C45
//
//  Parameters:
//
//    Input, double A, B, C, X, the arguments of the function.
//    C must not be equal to a nonpositive integer.
//    X < 1.
//
//    Output, double R8_HYPER_2F1, the value of the function.
//
{
  double a0;
  double aa;
  double bb;
  double c0;
  double c1;
  double el = 0.5772156649015329;
  double eps;
  double f0;
  double f1;
  double g0;
  double g1;
  double g2;
  double g3;
  double ga;
  double gabc;
  double gam;
  double gb;
  double gbm;
  double gc;
  double gca;
  double gcab;
  double gcb;
  double gm;
  double hf;
  double hw;
  int j;
  int k;
  bool l0;
  bool l1;
  bool l2;
  bool l3;
  bool l4;
  bool l5;
  int m;
  int nm;
  double pa;
  double pb;
  const double r8_pi = 3.141592653589793;
  double r;
  double r0;
  double r1;
  double rm;
  double rp;
  double sm;
  double sp;
  double sp0;
  double x1;

  l0 = ( c == int( c ) ) && ( c < 0.0 );
  l1 = ( 1.0 - x < 1.0E-15 ) && ( c - a - b <= 0.0 );
  l2 = ( a == int( a ) ) && ( a < 0.0 );
  l3 = ( b == int( b ) ) && ( b < 0.0 );
  l4 = ( c - a == int( c - a ) ) && ( c - a <= 0.0 );
  l5 = ( c - b == int( c - b ) ) && ( c - b <= 0.0 );

  if ( l0 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  C is integral and negative.\n";
    std::cerr << "  C = " << c << "\n";
    exit ( 1 );
  }

  if ( l1 )
  {
    std::cerr << "\n";
    std::cerr << "R8_HYPER_2F1 - Fatal error!\n";
    std::cerr << "  The hypergeometric series is divergent.\n";
    std::cerr << "  1 - X < 0, C - A - B <= 0\n";
    std::cerr << "  A = " << a << "\n";
    std::cerr << "  B = " << b << "\n";
    std::cerr << "  C = " << c << "\n";
    std::cerr << "  X = " << x << "\n";
    exit ( 1 );
  }

  if ( 0.95 < x )
  {
    eps = 1.0E-08;
  }
  else
  {
    eps = 1.0E-15;
  }

  if ( x == 0.0 || a == 0.0 || b == 0.0 )
  {
    hf = 1.0;
    return hf;
  }
  else if ( 1.0 - x == eps && 0.0 < c - a - b )
  {
    gc = tgamma ( c );
    gcab = tgamma ( c - a - b );
    gca = tgamma ( c - a );
    gcb = tgamma ( c - b );
    hf = gc * gcab / ( gca * gcb );
    return hf;
  }
  else if ( 1.0 + x <= eps && fabs ( c - a + b - 1.0 ) <= eps )
  {
    g0 = sqrt ( r8_pi ) * pow ( 2.0, - a );
    g1 = tgamma ( c );
    g2 = tgamma ( 1.0 + a / 2.0 - b );
    g3 = tgamma ( 0.5 + 0.5 * a );
    hf = g0 * g1 / ( g2 * g3 );
    return hf;
  }
  else if ( l2 || l3 )
  {
    if ( l2 )
    {
      nm = int( fabs ( a ) );
    }

    if ( l3 )
    {
      nm = int( fabs ( b ) );
    }

    hf = 1.0;
    r = 1.0;

    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }

    return hf;
  }
  else if ( l4 || l5 )
  {
    if ( l4 )
    {
      nm = int( fabs ( c - a ) );
    }

    if ( l5 )
    {
      nm = int( fabs ( c - b ) );
    }

    hf = 1.0;
    r  = 1.0;
    for ( k = 1; k <= nm; k++ )
    {
      r = r * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;
      hf = hf + r;
    }
    hf = pow ( 1.0 - x, c - a - b ) * hf;
    return hf;
  }

  aa = a;
  bb = b;
  x1 = x;

  if ( x < 0.0 )
  {
    x = x / ( x - 1.0 );
    if ( a < c && b < a && 0.0 < b )
    {
      a = bb;
      b = aa;
    }
    b = c - b;
  }

  if ( 0.75 <= x )
  {
    gm = 0.0;

    if ( fabs ( c - a - b - int( c - a - b ) ) < 1.0E-15 )
    {
      m = int( c - a - b );
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gam = tgamma ( a + m );
      gbm = tgamma ( b + m );

      pa = r8_psi ( a );
      pb = r8_psi ( b );

      if ( m != 0 )
      {
        gm = 1.0;
      }

      for ( j = 1; j <= std::abs ( m ) - 1; j++ )
      {
        gm = gm * j;
      }

      rm = 1.0;
      for ( j = 1; j <= std::abs ( m ); j++ )
      {
        rm = rm * j;
      }

      f0 = 1.0;
      r0 = 1.0;;
      r1 = 1.0;
      sp0 = 0.0;;
      sp = 0.0;

      if ( 0 <= m )
      {
        c0 = gm * gc / ( gam * gbm );
        c1 = - gc * pow ( x - 1.0, m ) / ( ga * gb * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / ( a + k - 1.0 ) + 1.0 / ( b + k - 1.0 ) 
          - 1.0 / double( k );
        }

        f1 = pa + pb + sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + ( 1.0 - a ) 
              / ( ( j + k ) * ( a + j + k - 1.0 ) ) 
              + 1.0 / ( b + j + k - 1.0 );
          }

          rp = pa + pb + 2.0 * el + sp + sm + log ( 1.0 - x );

          r1 = r1 * ( a + m + k - 1.0 ) * ( b + m + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }
          hw = f1;
        }
        hf = f0 * c0 + f1 * c1;
      }
      else if ( m < 0 )
      {
        m = - m;
        c0 = gm * gc / ( ga * gb * pow ( 1.0 - x, m ) );
        c1 = - pow ( - 1.0, m ) * gc / ( gam * gbm * rm );

        for ( k = 1; k <= m - 1; k++ )
        {
          r0 = r0 * ( a - m + k - 1.0 ) * ( b - m + k - 1.0 ) 
            / ( k * ( k - m ) ) * ( 1.0 - x );
          f0 = f0 + r0;
        }

        for ( k = 1; k <= m; k++ )
        {
          sp0 = sp0 + 1.0 / double( k );
        }

        f1 = pa + pb - sp0 + 2.0 * el + log ( 1.0 - x );
        hw = f1;

        for ( k = 1; k <= 250; k++ )
        {
          sp = sp + ( 1.0 - a ) 
            / ( k * ( a + k - 1.0 ) ) 
            + ( 1.0 - b ) / ( k * ( b + k - 1.0 ) );

          sm = 0.0;
          for ( j = 1; j <= m; j++ )
          {
            sm = sm + 1.0 / double( j + k );
          }

          rp = pa + pb + 2.0 * el + sp - sm + log ( 1.0 - x );

          r1 = r1 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
            / ( k * ( m + k ) ) * ( 1.0 - x );

          f1 = f1 + r1 * rp;

          if ( fabs ( f1 - hw ) < fabs ( f1 ) * eps )
          {
            break;
          }

          hw = f1;
        }

        hf = f0 * c0 + f1 * c1;
      }
    }
    else
    {
      ga = tgamma ( a );
      gb = tgamma ( b );
      gc = tgamma ( c );
      gca = tgamma ( c - a );
      gcb = tgamma ( c - b );
      gcab = tgamma ( c - a - b );
      gabc = tgamma ( a + b - c );
      c0 = gc * gcab / ( gca * gcb );
      c1 = gc * gabc / ( ga * gb ) * pow ( 1.0 - x, c - a - b );
      hf = 0.0;
      hw = hf;
      r0 = c0;
      r1 = c1;

      for ( k = 1; k <= 250; k++ )
      {
        r0 = r0 * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
          / ( k * ( a + b - c + k ) ) * ( 1.0 - x );

        r1 = r1 * ( c - a + k - 1.0 ) * ( c - b + k - 1.0 ) 
          / ( k * ( c - a - b + k ) ) * ( 1.0 - x );

        hf = hf + r0 + r1;

        if ( fabs ( hf - hw ) < fabs ( hf ) * eps )
        {
          break;
        }
        hw = hf;
      }
      hf = hf + c0 + c1;
    }
  }
  else
  {
    a0 = 1.0;

    if ( a < c && c < 2.0 * a && b < c && c < 2.0 * b )
    {
      a0 = pow ( 1.0 - x, c - a - b );
      a = c - a;
      b = c - b;
    }

    hf = 1.0;
    hw = hf;
    r = 1.0;

    for ( k = 1; k <= 250; k++ )
    {
      r = r * ( a + k - 1.0 ) * ( b + k - 1.0 ) 
        / ( k * ( c + k - 1.0 ) ) * x;

      hf = hf + r;

      if ( fabs ( hf - hw ) <= fabs ( hf ) * eps )
      {
        break;
      }

      hw = hf;
    }
    hf = a0 * hf;
  }

  if ( x1 < 0.0 )
  {
    x = x1;
    c0 = 1.0 / pow ( 1.0 - x, aa );
    hf = c0 * hf;
  }

  a = aa;
  b = bb;

  if ( 120 < k )
  {
    std::cout << "\n";
    std::cout << "R8_HYPER_2F1 - Warning!\n";
    std::cout << "  A large number of iterations were needed.\n";
    std::cout << "  The accuracy of the results should be checked.\n";
  }

  return hf;
}